

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_store.cc
# Opt level: O1

string * rcg::storeImageAsDisparityPFM
                   (string *__return_storage_ptr__,string *name,Image *image,int inv,float scale,
                   float offset)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  _Head_base<0UL,_unsigned_char_*,_false> _Var4;
  pointer pcVar5;
  ostream *poVar6;
  uchar *puVar7;
  long *plVar8;
  IOException *pIVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  long lVar11;
  size_t sVar12;
  size_t sVar13;
  uchar *puVar14;
  uchar *puVar15;
  uchar *puVar16;
  float fVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ofstream out;
  string local_270;
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  undefined1 local_230 [8];
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  int aiStack_210 [4];
  undefined1 *local_200;
  undefined1 *local_1f8;
  ios_base local_138 [264];
  
  if (image->pixelformat != 0x11000b8) {
    pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
    local_250[0] = local_240;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_250,"storeImageAsDisparityPFM(): Format Coord3D_C16 expected: ","");
    GetPixelFormatName((PfncFormat)image->pixelformat);
    plVar8 = (long *)std::__cxx11::string::append((char *)local_250);
    local_230 = (undefined1  [8])*plVar8;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar8 + 2);
    if (local_230 == (undefined1  [8])paVar10) {
      local_220._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_220._8_8_ = plVar8[3];
      local_230 = (undefined1  [8])&local_220;
    }
    else {
      local_220._M_allocated_capacity = paVar10->_M_allocated_capacity;
    }
    local_228 = plVar8[1];
    *plVar8 = (long)paVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    anon_unknown_1::IOException::IOException(pIVar9,(string *)local_230);
    __cxa_throw(pIVar9,&(anonymous_namespace)::IOException::typeinfo,
                anon_unknown_1::IOException::~IOException);
  }
  if ((scale == 0.0) && (!NAN(scale))) {
    pIVar9 = (IOException *)__cxa_allocate_exception(0x28);
    local_230 = (undefined1  [8])&local_220;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_230,"storeImageAsDisparityPFM(): Scale must not be 0!","");
    anon_unknown_1::IOException::IOException(pIVar9,(string *)local_230);
    __cxa_throw(pIVar9,&(anonymous_namespace)::IOException::typeinfo,
                anon_unknown_1::IOException::~IOException);
  }
  sVar1 = image->xpadding;
  sVar2 = image->width;
  sVar3 = image->height;
  _Var4._M_head_impl =
       (image->pixel)._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  pcVar5 = (name->_M_dataplus)._M_p;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,pcVar5,pcVar5 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_270);
  ensureNewFileName(__return_storage_ptr__,&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  std::ofstream::ofstream(local_230,(string *)__return_storage_ptr__,_S_bin);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"Pf",2);
  std::ios::widen((char)(ostream *)local_230 + (char)*(undefined8 *)((long)local_230 + -0x18));
  std::ostream::put((char)local_230);
  std::ostream::flush();
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_230,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  if (sVar3 != 0) {
    lVar11 = (sVar2 + sVar1) * -4;
    sVar13 = 0;
    puVar14 = _Var4._M_head_impl + (sVar3 + 1) * (sVar2 + sVar1) * 2;
    do {
      if (*(int *)((long)aiStack_210 + *(long *)((long)local_230 + -0x18)) != 0) break;
      puVar16 = puVar14 + lVar11;
      puVar15 = puVar16;
      if (sVar2 != 0) {
        puVar15 = puVar14 + lVar11;
        sVar12 = sVar2;
        do {
          puVar7 = puVar16 + 1;
          puVar14 = puVar16;
          if (image->bigendian != false) {
            puVar7 = puVar16;
            puVar14 = puVar16 + 1;
          }
          fVar17 = (float)CONCAT11(*puVar7,*puVar14) * scale + offset;
          if ((uint)CONCAT11(*puVar7,*puVar14) == inv) {
            fVar17 = INFINITY;
          }
          if (local_200 < local_1f8) {
            *local_200 = (char)((uint)fVar17 >> 0x18);
            local_200 = local_200 + 1;
          }
          else {
            (**(code **)(local_228 + 0x68))(&local_228);
          }
          if (local_200 < local_1f8) {
            *local_200 = (char)((uint)fVar17 >> 0x10);
            local_200 = local_200 + 1;
          }
          else {
            (**(code **)(local_228 + 0x68))(&local_228,(uint)fVar17 >> 0x10 & 0xff);
          }
          if (local_200 < local_1f8) {
            *local_200 = (char)((uint)fVar17 >> 8);
            local_200 = local_200 + 1;
          }
          else {
            (**(code **)(local_228 + 0x68))(&local_228,(uint)fVar17 >> 8 & 0xff);
          }
          if (local_200 < local_1f8) {
            *local_200 = SUB41(fVar17,0);
            local_200 = local_200 + 1;
          }
          else {
            (**(code **)(local_228 + 0x68))(&local_228,(uint)fVar17 & 0xff);
          }
          puVar16 = puVar16 + sVar1 + 2;
          puVar15 = puVar15 + sVar1 + 2;
          sVar12 = sVar12 - 1;
        } while (sVar12 != 0);
      }
      sVar13 = sVar13 + 1;
      puVar14 = puVar15;
    } while (sVar13 != sVar3);
  }
  std::ofstream::close();
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _png_destroy_write_struct;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string storeImageAsDisparityPFM(const std::string &name, const Image &image, int inv,
  float scale, float offset)
{
  if (image.getPixelFormat() != Coord3D_C16)
  {
    throw IOException(std::string("storeImageAsDisparityPFM(): Format Coord3D_C16 expected: ")+
      GetPixelFormatName(static_cast<PfncFormat>(image.getPixelFormat())));
  }

  if (scale == 0)
  {
    throw IOException(std::string("storeImageAsDisparityPFM(): Scale must not be 0!"));
  }

  // convert values and store disparity image

  size_t px=image.getXPadding();
  size_t width=image.getWidth();
  size_t height=image.getHeight();
  const unsigned char *p=static_cast<const unsigned char *>(image.getPixels())+
    2*(width+px)*(height+1);

  std::string full_name=ensureNewFileName(name+".pfm");
  std::ofstream out(full_name, std::ios::binary);

  out << "Pf" << std::endl;
  out << width << " " << height << std::endl;
  out << 1 << "\n";

  std::streambuf *sb=out.rdbuf();

  // get 16 bit data, scale and add offset and store as big endian

  bool msbfirst=true;

  {
    int pp=1;
    char *cc=reinterpret_cast<char *>(&pp);
    msbfirst=(cc[0] != 1);
  }

  for (size_t k=0; k<height && out.good(); k++)
  {
    p-=(width+px)<<2;
    for (size_t i=0; i<width; i++)
    {
      int val;
      if (image.isBigEndian())
      {
        val=(static_cast<int>(p[0])<<8)|p[1];
      }
      else
      {
        val=(static_cast<int>(p[1])<<8)|p[0];
      }

      p+=2;

      float d=std::numeric_limits<float>::infinity();
      if (val != inv)
      {
        d=static_cast<float>(val*scale+offset);
      }

      char *c=reinterpret_cast<char *>(&d);

      if (msbfirst)
      {
        sb->sputc(c[0]);
        sb->sputc(c[1]);
        sb->sputc(c[2]);
        sb->sputc(c[3]);
      }
      else
      {
        sb->sputc(c[3]);
        sb->sputc(c[2]);
        sb->sputc(c[1]);
        sb->sputc(c[0]);
      }

      p+=px;
    }
  }

  out.close();

  return full_name;
}